

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_do(connectdata *conn,_Bool *done)

{
  CURLcode CVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 connected;
  SessionHandle *pSVar5;
  _Bool *p_Var4;
  
  *done = false;
  Curl_reset_reqproto(conn);
  CVar1 = pop3_init(conn);
  if (CVar1 != CURLE_OK) {
    return CVar1;
  }
  CVar1 = Curl_urldecode(conn->data,(conn->data->state).path,0,&(conn->proto).ftpc.entrypath,
                         (size_t *)0x0,true);
  if (CVar1 != CURLE_OK) {
    return CVar1;
  }
  pSVar5 = conn->data;
  pcVar2 = (pSVar5->set).str[4];
  if (pcVar2 != (char *)0x0) {
    CVar1 = Curl_urldecode(pSVar5,pcVar2,0,&(conn->proto).pop3c.custom,(size_t *)0x0,true);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    pSVar5 = conn->data;
  }
  (pSVar5->req).size = -1;
  Curl_pgrsSetUploadCounter(pSVar5,0);
  Curl_pgrsSetDownloadCounter(pSVar5,0);
  Curl_pgrsSetUploadSize(pSVar5,0);
  Curl_pgrsSetDownloadSize(pSVar5,0);
  pSVar5 = conn->data;
  if ((pSVar5->set).opt_no_body == true) {
    ((pSVar5->state).proto.ftp)->transfer = FTPTRANSFER_INFO;
  }
  *done = false;
  pcVar2 = (conn->proto).ftpc.entrypath;
  if (*pcVar2 == '\0') {
LAB_0012fbd2:
    pcVar2 = (conn->proto).pop3c.custom;
    if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
      pcVar2 = "LIST";
    }
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,pcVar2);
    connected = SUB81(pcVar2,0);
  }
  else {
    if ((pSVar5->set).ftp_list_only == true) {
      ((pSVar5->state).proto.ftp)->transfer = FTPTRANSFER_INFO;
      if (*pcVar2 == '\0') goto LAB_0012fbd2;
      pcVar2 = "LIST";
    }
    else {
      pcVar2 = "RETR";
    }
    pcVar3 = (conn->proto).pop3c.custom;
    if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
      pcVar3 = pcVar2;
    }
    connected = 0x60;
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s %s",pcVar3);
  }
  if (CVar1 == CURLE_OK) {
    (conn->proto).ftpc.count2 = 0x10;
    if ((conn->data->state).used_interface == Curl_if_multi) {
      p_Var4 = done;
      CVar1 = pop3_multi_statemach(conn,done);
      connected = SUB81(p_Var4,0);
    }
    else {
      CVar1 = pop3_easy_statemach(conn);
      *done = true;
    }
    if (CVar1 == CURLE_OK) {
      CVar1 = CURLE_OK;
      if (*done == true) {
        pop3_dophase_done(conn,(_Bool)connected);
        CVar1 = CURLE_OK;
      }
    }
  }
  return CVar1;
}

Assistant:

static CURLcode pop3_do(struct connectdata *conn, bool *done)
{
  CURLcode retcode = CURLE_OK;

  *done = FALSE; /* default to false */

  /*
    Since connections can be re-used between SessionHandles, this might be a
    connection already existing but on a fresh SessionHandle struct so we must
    make sure we have a good 'struct POP3' to play with. For new connections,
    the struct POP3 is allocated and setup in the pop3_connect() function.
  */
  Curl_reset_reqproto(conn);
  retcode = pop3_init(conn);
  if(retcode)
    return retcode;

  /* Parse the URL path */
  retcode = pop3_parse_url_path(conn);
  if(retcode)
    return retcode;

  /* Parse the custom request */
  retcode = pop3_parse_custom_request(conn);
  if(retcode)
    return retcode;

  retcode = pop3_regular_transfer(conn, done);

  return retcode;
}